

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

uint8 * __thiscall
google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(EpsCopyOutputStream *this,uint8 *ptr)

{
  ulong uVar1;
  uint8 *puVar2;
  uint8 *in_RSI;
  ulong *in_RDI;
  int overrun;
  EpsCopyOutputStream *in_stack_ffffffffffffffa8;
  uint8 *local_18;
  
  local_18 = in_RSI;
  do {
    if ((in_RDI[7] & 1) != 0) {
      return (uint8 *)(in_RDI + 2);
    }
    uVar1 = *in_RDI;
    puVar2 = Next(in_stack_ffffffffffffffa8);
    local_18 = puVar2 + ((int)local_18 - (int)uVar1);
  } while ((uint8 *)*in_RDI <= local_18);
  return local_18;
}

Assistant:

uint8* EpsCopyOutputStream::EnsureSpaceFallback(uint8* ptr) {
  do {
    if (PROTOBUF_PREDICT_FALSE(had_error_)) return buffer_;
    int overrun = ptr - end_;
    GOOGLE_DCHECK(overrun >= 0);           // NOLINT
    GOOGLE_DCHECK(overrun <= kSlopBytes);  // NOLINT
    ptr = Next() + overrun;
  } while (ptr >= end_);
  GOOGLE_DCHECK(ptr < end_);  // NOLINT
  return ptr;
}